

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_1::SymbolTable::Populate(SymbolTable *this,Module *module)

{
  Global *pGVar1;
  Table *pTVar2;
  Func *pFVar3;
  bool bVar4;
  reference ppEVar5;
  Func *pFVar6;
  const_reference ppFVar7;
  size_type sVar8;
  Table *pTVar9;
  const_reference ppTVar10;
  Global *pGVar11;
  const_reference ppGVar12;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar13;
  string_view sVar14;
  Global local_204;
  string_view local_200;
  Enum local_1ec;
  key_type local_1e8;
  byte local_1e2;
  byte local_1e1;
  bool exported_2;
  value_type pGStack_1e0;
  bool imported_2;
  Global *global;
  size_t i_2;
  string_view local_1c8;
  Enum local_1b4;
  key_type local_1b0;
  byte local_1aa;
  byte local_1a9;
  bool exported_1;
  value_type pTStack_1a8;
  bool imported_1;
  Table *table;
  size_t i_1;
  string_view local_190;
  Enum local_17c;
  key_type local_178;
  byte local_172;
  byte local_171;
  bool exported;
  value_type pFStack_170;
  bool imported;
  Func *func;
  size_t i;
  undefined1 local_158;
  Index local_14c;
  _Base_ptr local_148;
  undefined1 local_140;
  Index local_134;
  _Base_ptr local_130;
  undefined1 local_128;
  Index local_11c;
  _Base_ptr local_118;
  undefined1 local_110;
  Index local_104;
  Export *local_100;
  Export *export_;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::Export_*,_std::allocator<wabt::Export_*>_> *__range2;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> exported_tables;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> exported_tags;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> exported_globals;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> exported_funcs;
  Module *module_local;
  SymbolTable *this_local;
  
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &exported_globals._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &exported_tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &exported_tables._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&__range2)
  ;
  __end2 = std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>::begin(&module->exports);
  export_ = (Export *)
            std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>::end(&module->exports);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wabt::Export_*const_*,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
                                *)&export_);
    if (!bVar4) break;
    ppEVar5 = __gnu_cxx::
              __normal_iterator<wabt::Export_*const_*,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
              ::operator*(&__end2);
    local_100 = *ppEVar5;
    switch(local_100->kind) {
    case First:
      local_104 = Module::GetFuncIndex(module,&local_100->var);
      pVar13 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
               insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      &exported_globals._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_104)
      ;
      local_118 = (_Base_ptr)pVar13.first._M_node;
      local_110 = pVar13.second;
      break;
    case Table:
      local_11c = Module::GetTableIndex(module,&local_100->var);
      pVar13 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
               insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      &__range2,&local_11c);
      local_130 = (_Base_ptr)pVar13.first._M_node;
      local_128 = pVar13.second;
      break;
    case Memory:
      break;
    case Global:
      local_134 = Module::GetGlobalIndex(module,&local_100->var);
      pVar13 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
               insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      &exported_tags._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_134);
      local_148 = (_Base_ptr)pVar13.first._M_node;
      local_140 = pVar13.second;
      break;
    case Last:
      local_14c = Module::GetTagIndex(module,&local_100->var);
      pVar13 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
               insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      &exported_tables._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_14c);
      i = (size_t)pVar13.first._M_node;
      local_158 = pVar13.second;
    }
    __gnu_cxx::
    __normal_iterator<wabt::Export_*const_*,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
    ::operator++(&__end2);
  }
  func = (Func *)0x0;
  while( true ) {
    pFVar3 = func;
    pFVar6 = (Func *)std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::size(&module->funcs);
    if (pFVar6 <= pFVar3) break;
    ppFVar7 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::operator[]
                        (&module->funcs,(size_type)func);
    pFStack_170 = *ppFVar7;
    local_171 = func < (Func *)(ulong)module->num_func_imports;
    local_178 = (key_type)func;
    sVar8 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       &exported_globals._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_178
                      );
    local_172 = sVar8 != 0;
    sVar14 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)pFStack_170);
    i_1._4_4_ = SUB84(func,0);
    local_190 = sVar14;
    local_17c = (Enum)AddSymbol<wabt::(anonymous_namespace)::Symbol::Function>
                                (this,&this->functions_,sVar14,(bool)(local_171 & 1),
                                 (bool)(local_172 & 1),(Function *)((long)&i_1 + 4));
    bVar4 = Failed((Result)local_17c);
    if (bVar4) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      goto LAB_0013db63;
    }
    func = (Func *)&(func->name).field_0x1;
  }
  table = (Table *)0x0;
  while( true ) {
    pTVar2 = table;
    pTVar9 = (Table *)std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::size
                                (&module->tables);
    if (pTVar9 <= pTVar2) break;
    ppTVar10 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::operator[]
                         (&module->tables,(size_type)table);
    pTStack_1a8 = *ppTVar10;
    local_1a9 = table < (Table *)(ulong)module->num_table_imports;
    local_1b0 = (key_type)table;
    sVar8 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       &__range2,&local_1b0);
    local_1aa = sVar8 != 0;
    sVar14 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)pTStack_1a8);
    i_2._4_4_ = SUB84(table,0);
    local_1c8 = sVar14;
    local_1b4 = (Enum)AddSymbol<wabt::(anonymous_namespace)::Symbol::Table>
                                (this,&this->tables_,sVar14,(bool)(local_1a9 & 1),
                                 (bool)(local_1aa & 1),(Table *)((long)&i_2 + 4));
    bVar4 = Failed((Result)local_1b4);
    if (bVar4) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      goto LAB_0013db63;
    }
    table = (Table *)&(table->name).field_0x1;
  }
  global = (Global *)0x0;
  do {
    pGVar1 = global;
    pGVar11 = (Global *)
              std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>::size(&module->globals);
    if (pGVar11 <= pGVar1) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
LAB_0013db63:
      i_1._0_4_ = 1;
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 &__range2);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 &exported_tables._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 &exported_tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 &exported_globals._M_t._M_impl.super__Rb_tree_header._M_node_count);
      return (Result)this_local._4_4_;
    }
    ppGVar12 = std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>::operator[]
                         (&module->globals,(size_type)global);
    pGStack_1e0 = *ppGVar12;
    local_1e1 = global < (Global *)(ulong)module->num_global_imports;
    local_1e8 = (key_type)global;
    sVar8 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       &exported_tags._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_1e8);
    local_1e2 = sVar8 != 0;
    sVar14 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)pGStack_1e0);
    local_204.index = (Index)global;
    local_200 = sVar14;
    local_1ec = (Enum)AddSymbol<wabt::(anonymous_namespace)::Symbol::Global>
                                (this,&this->globals_,sVar14,(bool)(local_1e1 & 1),
                                 (bool)(local_1e2 & 1),&local_204);
    bVar4 = Failed((Result)local_1ec);
    if (bVar4) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      goto LAB_0013db63;
    }
    global = (Global *)&(global->name).field_0x1;
  } while( true );
}

Assistant:

Result Populate(const Module* module) {
    std::set<Index> exported_funcs;
    std::set<Index> exported_globals;
    std::set<Index> exported_tags;
    std::set<Index> exported_tables;

    for (const Export* export_ : module->exports) {
      switch (export_->kind) {
        case ExternalKind::Func:
          exported_funcs.insert(module->GetFuncIndex(export_->var));
          break;
        case ExternalKind::Table:
          exported_tables.insert(module->GetTableIndex(export_->var));
          break;
        case ExternalKind::Memory:
          break;
        case ExternalKind::Global:
          exported_globals.insert(module->GetGlobalIndex(export_->var));
          break;
        case ExternalKind::Tag:
          exported_tags.insert(module->GetTagIndex(export_->var));
          break;
      }
    }

    // We currently only create symbol table entries for function, table, and
    // global symbols.
    for (size_t i = 0; i < module->funcs.size(); ++i) {
      const Func* func = module->funcs[i];
      bool imported = i < module->num_func_imports;
      bool exported = exported_funcs.count(i);
      CHECK_RESULT(AddSymbol(&functions_, func->name, imported, exported,
                             Symbol::Function{Index(i)}));
    }

    for (size_t i = 0; i < module->tables.size(); ++i) {
      const Table* table = module->tables[i];
      bool imported = i < module->num_table_imports;
      bool exported = exported_tables.count(i);
      CHECK_RESULT(AddSymbol(&tables_, table->name, imported, exported,
                             Symbol::Table{Index(i)}));
    }

    for (size_t i = 0; i < module->globals.size(); ++i) {
      const Global* global = module->globals[i];
      bool imported = i < module->num_global_imports;
      bool exported = exported_globals.count(i);
      CHECK_RESULT(AddSymbol(&globals_, global->name, imported, exported,
                             Symbol::Global{Index(i)}));
    }

    return Result::Ok;
  }